

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * __thiscall
cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *path)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(char *)this,&local_31);
  cmsys::SystemTools::ConvertToUnixOutputPath(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ConvertToRunCommandPath(const char* path)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  return cmSystemTools::ConvertToWindowsOutputPath(path);
#else
  return cmSystemTools::ConvertToUnixOutputPath(path);
#endif
}